

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

void __thiscall irr::video::COpenGLDriver::addHighLevelShaderMaterial(COpenGLDriver *this)

{
  E_VERTEX_SHADER_TYPE in_ECX;
  c8 *in_RDX;
  c8 *in_RSI;
  c8 *in_R8;
  c8 *in_R9;
  E_PIXEL_SHADER_TYPE in_stack_00000008;
  c8 *in_stack_00000010;
  c8 *in_stack_00000018;
  E_GEOMETRY_SHADER_TYPE in_stack_00000020;
  E_PRIMITIVE_TYPE in_stack_00000028;
  E_PRIMITIVE_TYPE in_stack_00000030;
  u32 in_stack_00000038;
  IShaderConstantSetCallBack *in_stack_00000040;
  E_MATERIAL_TYPE in_stack_00000048;
  s32 in_stack_00000050;
  
  addHighLevelShaderMaterial
            ((COpenGLDriver *)&this[-1].field_0x1108,in_RSI,in_RDX,in_ECX,in_R8,in_R9,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
             in_stack_00000048,in_stack_00000050);
  return;
}

Assistant:

s32 COpenGLDriver::addHighLevelShaderMaterial(
		const c8 *vertexShaderProgram,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const c8 *pixelShaderProgram,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const c8 *geometryShaderProgram,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType,
		scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	s32 nr = -1;

	COpenGLSLMaterialRenderer *r = new COpenGLSLMaterialRenderer(
			this, nr,
			vertexShaderProgram, vertexShaderEntryPointName, vsCompileTarget,
			pixelShaderProgram, pixelShaderEntryPointName, psCompileTarget,
			geometryShaderProgram, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	r->drop();

	return nr;
}